

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall
CVmRun::call_func_ptr_fr
          (CVmRun *this,vm_val_t *funcptr,uint argc,vm_rcdesc *recurse_ctx,uint caller_ofs)

{
  int iVar1;
  CVmObject *pCVar2;
  vm_rcdesc *pvVar3;
  uchar *puVar4;
  uchar *in_RCX;
  uint in_EDX;
  CVmRun *in_RSI;
  CVmRun *in_RDI;
  uint in_R8D;
  void *invoke_addr;
  CVmObject *io;
  vm_val_t invoker;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  pool_ofs_t ofs;
  CVmPoolInMem *in_stack_ffffffffffffffb0;
  int local_40 [2];
  vm_rcdesc *in_stack_ffffffffffffffc8;
  uchar *local_8;
  
  ofs = *(pool_ofs_t *)&(in_RSI->super_CVmStack).arr_;
  if (ofs != 5) {
    if (ofs == 0xc) {
      CVmPoolInMem::get_ptr(in_stack_ffffffffffffffb0,0xc);
      local_8 = do_call(in_RSI,in_EDX,in_RCX,in_R8D,in_stack_ffffffffffffffc8);
    }
    else {
      if (ofs != 0x10) {
        err_throw(0);
      }
      CVmStack::discard(5);
      call_bif(in_RDI,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
      local_8 = entry_ptr_native_ + in_R8D;
    }
    return local_8;
  }
  pCVar2 = vm_objp(0);
  iVar1 = (*pCVar2->_vptr_CVmObject[0xe])(pCVar2,local_40);
  if (iVar1 != 0) {
    pvVar3 = in_stack_ffffffffffffffc8;
    if (local_40[0] != 4) {
      if (local_40[0] == 0xc) {
        pvVar3 = (vm_rcdesc *)CVmPoolInMem::get_ptr(in_stack_ffffffffffffffb0,ofs);
      }
      else {
        pvVar3 = (vm_rcdesc *)0x0;
      }
    }
    if (pvVar3 != (vm_rcdesc *)0x0) {
      puVar4 = do_call(in_RSI,in_EDX,in_RCX,in_R8D,in_stack_ffffffffffffffc8);
      return puVar4;
    }
  }
  err_throw(0);
}

Assistant:

const uchar *CVmRun::call_func_ptr_fr(VMG_ const vm_val_t *funcptr, uint argc,
                                      const vm_rcdesc *recurse_ctx,
                                      uint caller_ofs)
{
    vm_val_t invoker;
    CVmObject *io;
    
    /* check what we have */
    switch (funcptr->typ)
    {
    case VM_OBJ:
        /* it's an object - check to see if it's invokable */
        if ((io = vm_objp(vmg_ funcptr->val.obj))->get_invoker(vmg_ &invoker))
        {
            /* get the invocation address, according to the invoker type */
            const void *invoke_addr;
            switch (invoker.typ)
            {
            case VM_FUNCPTR:
                invoke_addr = G_code_pool->get_ptr(invoker.val.ofs);
                break;
                
            case VM_CODEPTR:
                invoke_addr = invoker.val.ptr;
                break;
                
            default:
                invoke_addr = 0;
                break;
            }
            
            /* if we got a valid address, invoke the code */
            if (invoke_addr != 0)
            {
                /* call the function and return the new program counter */
                return do_call(
                    vmg_ caller_ofs, (const uchar *)invoke_addr, argc,
                    recurse_ctx);
            }
        }
        
        /* it's not invokable - throw an error */
        err_throw(VMERR_FUNCPTR_VAL_REQD);
        AFTER_ERR_THROW(return 0;)
            
    case VM_FUNCPTR:
        /* call the function */
        return do_call(vmg_ caller_ofs,
                       (const uchar *)G_code_pool->get_ptr(funcptr->val.ofs),
                       argc, recurse_ctx);
        
    case VM_BIFPTR:
        /* 
         *   Built-in function.  First, discard the invocation frame the
         *   caller set up for a regular method/function call, as builtins
         *   don't use those.  Then, decode the SetIndex:FuncIndex value and
         *   call the function.  
         */
        discard(5);
        call_bif(vmg_ funcptr->val.bifptr.set_idx,
                 funcptr->val.bifptr.func_idx, argc);

        /* proceed from the caller's address */
        return entry_ptr_native_ + caller_ofs;
        
    default:
        /* invalid type */
        err_throw(VMERR_FUNCPTR_VAL_REQD);
        AFTER_ERR_THROW(return 0;)
    }
}